

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

ExecuteResult __thiscall Statement::executeInsert(Statement *this,Table *t)

{
  uint32_t key;
  Cursor *c_00;
  Pager *this_00;
  char *node_00;
  uint32_t *puVar1;
  uint32_t keyAtIndex;
  uint32_t numOfCells;
  char *node;
  Cursor *c;
  uint32_t keyToInsert;
  Table *t_local;
  Statement *this_local;
  
  key = (this->rowToInsert).id;
  c_00 = Table::tableFind(t,key);
  this_00 = Table::getPager(t);
  node_00 = Pager::getPage(this_00,c_00->pageNum);
  puVar1 = leaf_node_num_cells(node_00);
  if ((c_00->cellNum < *puVar1) && (puVar1 = leaf_node_key(node_00,c_00->cellNum), *puVar1 == key))
  {
    this_local._4_4_ = ExecuteDuplicateKey;
  }
  else {
    Table::leafNodeInsert(t,c_00,(this->rowToInsert).id,&this->rowToInsert);
    if (c_00 != (Cursor *)0x0) {
      operator_delete(c_00,0x18);
    }
    this_local._4_4_ = ExecuteSucess;
  }
  return this_local._4_4_;
}

Assistant:

ExecuteResult Statement::executeInsert(Table *t) {
	uint32_t keyToInsert = rowToInsert.id;
	Cursor *c = t->tableFind(keyToInsert);

	char *node = t->getPager()->getPage(c->pageNum);
	uint32_t numOfCells = *(leaf_node_num_cells(node));

	if (c->cellNum < numOfCells) {
		uint32_t keyAtIndex = *leaf_node_key(node, c->cellNum);
		if (keyAtIndex == keyToInsert) {
			return ExecuteDuplicateKey;
		}
	}

	t->leafNodeInsert(c, rowToInsert.id, &rowToInsert);
	delete c;

	return ExecuteSucess;
}